

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CodeVerifySchemaAtToplevel(Parse *pToplevel,int iDb)

{
  sqlite3 *db;
  int iVar1;
  long in_FS_OFFSET;
  Btree *pBStack_28;
  long lStack_20;
  
  if (((pToplevel->cookieMask >> (iDb & 0x1fU) & 1) != 0) ||
     (pToplevel->cookieMask = pToplevel->cookieMask | 1 << ((byte)iDb & 0x1f), iDb != 1)) {
    return;
  }
  lStack_20 = *(long *)(in_FS_OFFSET + 0x28);
  db = pToplevel->db;
  if ((db->aDb[1].pBt == (Btree *)0x0) && (pToplevel->explain == '\0')) {
    pBStack_28 = (Btree *)&DAT_aaaaaaaaaaaaaaaa;
    iVar1 = sqlite3BtreeOpen(db->pVfs,(char *)0x0,db,&pBStack_28,0,0x21e);
    if (iVar1 == 0) {
      db->aDb[1].pBt = pBStack_28;
      iVar1 = sqlite3BtreeSetPageSize(pBStack_28,db->nextPagesize,0,0);
      if (iVar1 == 7) {
        sqlite3OomFault(db);
      }
    }
    else {
      sqlite3ErrorMsg(pToplevel,
                      "unable to open a temporary database file for storing temporary tables");
      pToplevel->rc = iVar1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void sqlite3CodeVerifySchemaAtToplevel(Parse *pToplevel, int iDb){
  assert( iDb>=0 && iDb<pToplevel->db->nDb );
  assert( pToplevel->db->aDb[iDb].pBt!=0 || iDb==1 );
  assert( iDb<SQLITE_MAX_DB );
  assert( sqlite3SchemaMutexHeld(pToplevel->db, iDb, 0) );
  if( DbMaskTest(pToplevel->cookieMask, iDb)==0 ){
    DbMaskSet(pToplevel->cookieMask, iDb);
    if( !OMIT_TEMPDB && iDb==1 ){
      sqlite3OpenTempDatabase(pToplevel);
    }
  }
}